

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Data<QHashPrivate::Node<QString,_QString>_> *
QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::detached
          (Data<QHashPrivate::Node<QString,_QString>_> *d,size_t size)

{
  Data<QHashPrivate::Node<QString,_QString>_> *this;
  
  this = (Data<QHashPrivate::Node<QString,_QString>_> *)operator_new(0x28);
  if (d == (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
    Data(this,size);
  }
  else {
    Data(this,d,size);
    if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (d->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (d->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        ~Data(d);
        operator_delete(d,0x28);
      }
    }
  }
  return this;
}

Assistant:

static Data *detached(Data *d, size_t size)
    {
        if (!d)
            return new Data(size);
        Data *dd = new Data(*d, size);
        if (!d->ref.deref())
            delete d;
        return dd;
    }